

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  Options *options;
  __node_base_ptr *pp_Var1;
  pointer ppSVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  bool bVar6;
  Options *in_RCX;
  Options *options_00;
  int i;
  ulong uVar7;
  int i_3;
  pointer ppSVar8;
  int i_2;
  undefined1 local_1c8 [8];
  CrossFileReferences refs;
  Formatter format;
  NamespaceOpener ns;
  
  refs.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)local_1c8);
  GetCrossFileReferencesForFile(this,this->file_,(CrossFileReferences *)local_1c8);
  GenerateInternalForwardDeclarations(this,(CrossFileReferences *)local_1c8,printer);
  options = &this->options_;
  Namespace_abi_cxx11_
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cpp *)this->file_,
             (FileDescriptor *)options,in_RCX);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Formatter *)&refs.weak_reflection_files._M_h._M_single_bucket);
  std::__cxx11::string::~string
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    GenerateSourceDefaultInstance(this,(int)uVar7,printer);
  }
  NamespaceOpener::~NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GenerateTables(this,printer);
  ppSVar2 = (this->sccs_).
            super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar8 = (this->sccs_).
                 super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar8 != ppSVar2;
      ppSVar8 = ppSVar8 + 1) {
    in_RCX = (Options *)printer;
    GenerateInitForSCC(this,*ppSVar8,(CrossFileReferences *)local_1c8,printer);
  }
  bVar6 = HasDescriptorMethods(this->file_,options);
  if (bVar6) {
    GenerateReflectionInitializationCode(this,printer);
  }
  Namespace_abi_cxx11_
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cpp *)this->file_,
             (FileDescriptor *)options,in_RCX);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Formatter *)&refs.weak_reflection_files._M_h._M_single_bucket);
  std::__cxx11::string::~string
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (uVar7 = 0;
      puVar3 = (this->enum_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->enum_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
      uVar7 = uVar7 + 1) {
    EnumGenerator::GenerateMethods
              ((EnumGenerator *)
               puVar3[uVar7]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
               ._M_t,(int)uVar7,printer);
  }
  pp_Var1 = &refs.weak_reflection_files._M_h._M_single_bucket;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    Formatter::operator()<>((Formatter *)pp_Var1,"\n");
    Formatter::operator()<>
              ((Formatter *)pp_Var1,
               "// ===================================================================\n");
    Formatter::operator()<>((Formatter *)pp_Var1,"\n");
    MessageGenerator::GenerateClassMethods
              ((MessageGenerator *)
               (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ._M_t,printer);
  }
  bVar6 = HasGenericServices(this->file_,options);
  if (bVar6) {
    pp_Var1 = &refs.weak_reflection_files._M_h._M_single_bucket;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(this->service_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->service_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      if (uVar7 == 0) {
        Formatter::operator()<>((Formatter *)pp_Var1,"\n");
      }
      Formatter::operator()<>
                ((Formatter *)pp_Var1,
                 "// ===================================================================\n");
      Formatter::operator()<>((Formatter *)pp_Var1,"\n");
      ServiceGenerator::GenerateImplementation
                ((ServiceGenerator *)
                 (this->service_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                 ._M_t,printer);
    }
  }
  for (uVar7 = 0;
      puVar4 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->extension_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3);
      uVar7 = uVar7 + 1) {
    ExtensionGenerator::GenerateDefinition
              ((ExtensionGenerator *)
               puVar4[uVar7]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ._M_t,printer);
  }
  Formatter::operator()<>
            ((Formatter *)&refs.weak_reflection_files._M_h._M_single_bucket,
             "\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ProtobufNamespace_abi_cxx11_
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cpp *)options,options_00);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Formatter *)&refs.weak_reflection_files._M_h._M_single_bucket);
  std::__cxx11::string::~string
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (uVar7 = 0;
      puVar5 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->message_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3);
      uVar7 = uVar7 + 1) {
    MessageGenerator::GenerateSourceInProto2Namespace
              ((MessageGenerator *)
               puVar5[uVar7]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
               ._M_t,printer);
  }
  NamespaceOpener::~NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>
            ((Formatter *)&refs.weak_reflection_files._M_h._M_single_bucket,
             "\n// @@protoc_insertion_point(global_scope)\n");
  std::__cxx11::string::string
            ((string *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "net/proto2/public/port_undef.inc",
             (allocator *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  IncludeFile(this,(string *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,printer)
  ;
  std::__cxx11::string::~string
            ((string *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CrossFileReferences::~CrossFileReferences((CrossFileReferences *)local_1c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);
  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  GenerateInternalForwardDeclarations(refs, printer);

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    for (int i = 0; i < message_generators_.size(); i++) {
      GenerateSourceDefaultInstance(i, printer);
    }
  }

  {
    GenerateTables(printer);

    // Now generate the InitDefaults for each SCC.
    for (auto scc : sccs_) {
      GenerateInitForSCC(scc, refs, printer);
    }

    if (HasDescriptorMethods(file_, options_)) {
      // Define the code to initialize reflection. This code uses a global
      // constructor to register reflection data with the runtime pre-main.
      GenerateReflectionInitializationCode(printer);
    }
  }

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Actually implement the protos

    // Generate enums.
    for (int i = 0; i < enum_generators_.size(); i++) {
      enum_generators_[i]->GenerateMethods(i, printer);
    }

    // Generate classes.
    for (int i = 0; i < message_generators_.size(); i++) {
      format("\n");
      format(kThickSeparator);
      format("\n");
      message_generators_[i]->GenerateClassMethods(printer);
    }

    if (HasGenericServices(file_, options_)) {
      // Generate services.
      for (int i = 0; i < service_generators_.size(); i++) {
        if (i == 0) format("\n");
        format(kThickSeparator);
        format("\n");
        service_generators_[i]->GenerateImplementation(printer);
      }
    }

    // Define extensions.
    for (int i = 0; i < extension_generators_.size(); i++) {
      extension_generators_[i]->GenerateDefinition(printer);
    }

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateSourceInProto2Namespace(printer);
    }
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");

  IncludeFile("net/proto2/public/port_undef.inc", printer);
}